

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

int64_t default_now(quicly_now_t *self)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  timeval tv;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  lVar1 = local_18.tv_usec / 1000 + local_18.tv_sec * 1000;
  lVar2 = *(long *)(in_FS_OFFSET + -8);
  if (*(long *)(in_FS_OFFSET + -8) < lVar1) {
    *(long *)(in_FS_OFFSET + -8) = lVar1;
    lVar2 = lVar1;
  }
  return lVar2;
}

Assistant:

static int64_t default_now(quicly_now_t *self)
{
    struct timeval tv;
    gettimeofday(&tv, NULL);
    int64_t tv_now = (int64_t)tv.tv_sec * 1000 + tv.tv_usec / 1000;

    /* make sure that the time does not get rewind */
    static __thread int64_t now;
    if (now < tv_now)
        now = tv_now;
    return now;
}